

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O2

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateValue
          (HtmlparserCppTest *this,string *expected_value)

{
  __type _Var1;
  char *pcVar2;
  allocator local_31;
  string parsed_state;
  
  pcVar2 = HtmlParser::value(&this->parser_);
  if (pcVar2 == (char *)0x0) {
    fprintf(_stderr,"Check failed: %s\n","parser_.value() != __null");
  }
  else {
    pcVar2 = HtmlParser::value(&this->parser_);
    std::__cxx11::string::string((string *)&parsed_state,pcVar2,&local_31);
    _Var1 = std::operator==(expected_value,&parsed_state);
    if (_Var1) {
      std::__cxx11::string::~string((string *)&parsed_state);
      return;
    }
    fprintf(_stderr,"Check failed: %s %s %s\n","expected_value","==","parsed_state");
  }
  exit(1);
}

Assistant:

void HtmlparserCppTest::ValidateValue(const string &expected_value) {
  EXPECT_TRUE(parser_.value() != NULL);
  const string parsed_state(parser_.value());
  EXPECT_EQ(expected_value, parsed_state)
      << "Unexpected value at line " << parser_.line_number();
}